

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_link_pg(SAM_hdr *hdr)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  kh_m_s2i_t *pkVar4;
  khint32_t *pkVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  byte bVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  SAM_hdr_tag *pSVar18;
  uint uVar19;
  
  hdr->npg_end_alloc = hdr->npg;
  piVar9 = (int *)realloc(hdr->pg_end,(long)hdr->npg << 2);
  hdr->pg_end = piVar9;
  if (piVar9 == (int *)0x0) {
    iVar16 = -1;
  }
  else {
    iVar16 = hdr->npg;
    if (0 < (long)iVar16) {
      lVar13 = 0;
      do {
        piVar9[lVar13] = (int)lVar13;
        lVar13 = lVar13 + 1;
      } while (iVar16 != lVar13);
    }
    iVar16 = 0;
    if (0 < hdr->npg) {
      lVar13 = 0;
      iVar16 = 0;
      do {
        pSVar18 = hdr->pg[lVar13].tag;
LAB_00134cdc:
        iVar17 = iVar16;
        if (pSVar18 == (SAM_hdr_tag *)0x0) goto LAB_00134e7f;
        pcVar3 = pSVar18->str;
        if ((*pcVar3 != 'P') || (pcVar3[1] != 'P')) goto LAB_00134cf4;
        cVar1 = pcVar3[pSVar18->len];
        pcVar3[pSVar18->len] = '\0';
        pkVar4 = hdr->pg_hash;
        pcVar3 = pSVar18->str;
        uVar12 = pkVar4->n_buckets;
        if (uVar12 == 0) {
          uVar12 = 0;
          goto LAB_00134e37;
        }
        cVar6 = pcVar3[3];
        uVar19 = (uint)cVar6;
        if (cVar6 == '\0') {
          uVar19 = 0;
        }
        else {
          cVar6 = pcVar3[4];
          if (cVar6 != '\0') {
            pcVar11 = pcVar3 + 5;
            do {
              uVar19 = (int)cVar6 + uVar19 * 0x1f;
              cVar6 = *pcVar11;
              pcVar11 = pcVar11 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar19 = uVar19 & uVar12 - 1;
        pkVar5 = pkVar4->flags;
        iVar17 = 1;
        uVar14 = uVar19;
        do {
          uVar2 = pkVar5[uVar14 >> 4];
          bVar10 = (char)uVar14 * '\x02' & 0x1e;
          uVar7 = uVar2 >> bVar10;
          if (((uVar7 & 2) != 0) ||
             (((uVar7 & 1) == 0 && (iVar8 = strcmp(pkVar4->keys[uVar14],pcVar3 + 3), iVar8 == 0))))
          {
            if ((uVar2 >> bVar10 & 3) == 0) {
              uVar12 = uVar14;
            }
            break;
          }
          uVar14 = uVar14 + iVar17 & uVar12 - 1;
          iVar17 = iVar17 + 1;
        } while (uVar14 != uVar19);
LAB_00134e37:
        pcVar3[pSVar18->len] = cVar1;
        iVar17 = -1;
        if (uVar12 != hdr->pg_hash->n_buckets) {
          piVar9 = hdr->pg_hash->vals;
          hdr->pg[lVar13].prev_id = hdr->pg[piVar9[uVar12]].id;
          hdr->pg_end[piVar9[uVar12]] = -1;
          iVar17 = iVar16;
        }
LAB_00134e7f:
        iVar16 = iVar17;
        lVar13 = lVar13 + 1;
        if (hdr->npg <= lVar13) break;
      } while( true );
    }
    iVar17 = 0;
    if (0 < hdr->npg) {
      piVar9 = hdr->pg_end;
      lVar13 = 0;
      iVar17 = 0;
      do {
        iVar8 = piVar9[lVar13];
        if (iVar8 != -1) {
          lVar15 = (long)iVar17;
          iVar17 = iVar17 + 1;
          piVar9[lVar15] = iVar8;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < hdr->npg);
    }
    hdr->npg_end = iVar17;
  }
  return iVar16;
LAB_00134cf4:
  pSVar18 = pSVar18->next;
  goto LAB_00134cdc;
}

Assistant:

int sam_hdr_link_pg(SAM_hdr *hdr) {
    int i, j, ret = 0;

    hdr->npg_end_alloc = hdr->npg;
    hdr->pg_end = realloc(hdr->pg_end, hdr->npg * sizeof(*hdr->pg_end));
    if (!hdr->pg_end)
	return -1;

    for (i = 0; i < hdr->npg; i++)
	hdr->pg_end[i] = i;

    for (i = 0; i < hdr->npg; i++) {
	khint_t k;
	SAM_hdr_tag *tag;
	char tmp;

	for (tag = hdr->pg[i].tag; tag; tag = tag->next) {
	    if (tag->str[0] == 'P' && tag->str[1] == 'P')
		break;
	}
	if (!tag) {
	    /* Chain start points */
	    continue;
	}

	tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
	k = kh_get(m_s2i, hdr->pg_hash, tag->str+3);
	tag->str[tag->len] = tmp;

	if (k == kh_end(hdr->pg_hash)) {
	    ret = -1;
	    continue;
	}

	hdr->pg[i].prev_id = hdr->pg[kh_val(hdr->pg_hash, k)].id;
	hdr->pg_end[kh_val(hdr->pg_hash, k)] = -1;
    }

    for (i = j = 0; i < hdr->npg; i++) {
	if (hdr->pg_end[i] != -1)
	    hdr->pg_end[j++] = hdr->pg_end[i];
    }
    hdr->npg_end = j;

    return ret;
}